

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEDataPassThrough::deinitTestRun
          (TessellationShaderTCTEDataPassThrough *this,_run *run)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  _run *run_local;
  TessellationShaderTCTEDataPassThrough *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (run->fs_id != 0) {
    (**(code **)(lVar3 + 0x470))(run->fs_id);
    run->fs_id = 0;
  }
  if (run->gs_id != 0) {
    (**(code **)(lVar3 + 0x470))(run->gs_id);
    run->gs_id = 0;
  }
  if (run->po_id != 0) {
    (**(code **)(lVar3 + 0x448))(run->po_id);
    run->po_id = 0;
  }
  if (run->tcs_id != 0) {
    (**(code **)(lVar3 + 0x470))(run->tcs_id);
    run->tcs_id = 0;
  }
  if (run->tes_id != 0) {
    (**(code **)(lVar3 + 0x470))(run->tes_id);
    run->tes_id = 0;
  }
  if (run->vs_id != 0) {
    (**(code **)(lVar3 + 0x470))(run->vs_id);
    run->vs_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderTCTEDataPassThrough::deinitTestRun(_run& run)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (run.fs_id != 0)
	{
		gl.deleteShader(run.fs_id);

		run.fs_id = 0;
	}

	if (run.gs_id != 0)
	{
		gl.deleteShader(run.gs_id);

		run.gs_id = 0;
	}

	if (run.po_id != 0)
	{
		gl.deleteProgram(run.po_id);

		run.po_id = 0;
	}

	if (run.tcs_id != 0)
	{
		gl.deleteShader(run.tcs_id);

		run.tcs_id = 0;
	}

	if (run.tes_id != 0)
	{
		gl.deleteShader(run.tes_id);

		run.tes_id = 0;
	}

	if (run.vs_id != 0)
	{
		gl.deleteShader(run.vs_id);

		run.vs_id = 0;
	}
}